

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::HasEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  int32_t v;
  Node *pNVar1;
  Node *pNVar2;
  bool local_41;
  Node *xn;
  GraphCycles *this_local;
  GraphId y_local;
  GraphId x_local;
  
  pNVar1 = FindNode(this->rep_,x);
  local_41 = false;
  if (pNVar1 != (Node *)0x0) {
    pNVar2 = FindNode(this->rep_,y);
    local_41 = false;
    if (pNVar2 != (Node *)0x0) {
      v = anon_unknown_0::NodeIndex(y);
      local_41 = anon_unknown_0::NodeSet::contains(&pNVar1->out,v);
    }
  }
  return local_41;
}

Assistant:

bool GraphCycles::HasEdge(GraphId x, GraphId y) const {
  Node* xn = FindNode(rep_, x);
  return xn && FindNode(rep_, y) && xn->out.contains(NodeIndex(y));
}